

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O1

void __thiscall
CreateCharacterState::processConfirmCharacter
          (CreateCharacterState *this,string *input,shared_ptr<Connection> *connection)

{
  pointer pcVar1;
  element_type *peVar2;
  GameData *pGVar3;
  element_type *this_00;
  int iVar4;
  string *psVar5;
  string *__args_2;
  shared_ptr<GameData> *game_data;
  shared_ptr<Player> player;
  shared_ptr<Race> character_race;
  string command;
  undefined1 local_181;
  shared_ptr<Player> local_180;
  undefined1 local_170 [16];
  element_type *local_160;
  _Base_ptr local_158;
  shared_ptr<Player> local_150;
  undefined1 local_140 [16];
  _Base_ptr local_130 [2];
  undefined1 local_120 [16];
  undefined1 local_110 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [16];
  _Base_ptr local_d0;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (input->_M_dataplus)._M_p;
  local_130[0] = (_Base_ptr)local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,pcVar1,pcVar1 + input->_M_string_length);
  pcVar1 = (input->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_a0 + 0x10),pcVar1,pcVar1 + input->_M_string_length);
  Tokenizer::LowerCase(&local_50,(string *)(local_a0 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  iVar4 = std::__cxx11::string::compare((char *)local_130);
  if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_130), iVar4 == 0)) {
    peVar2 = (this->super_GameState).game_data.
             super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar5 = Connection::GetCharacterRace_abi_cxx11_
                       ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    local_b0._M_allocated_capacity = (size_type)(_Base_ptr)local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_c0 + 0x10),pcVar1,pcVar1 + psVar5->_M_string_length);
    GameData::GetRace((GameData *)local_140,(string *)peVar2);
    if ((_Base_ptr)local_b0._M_allocated_capacity != (_Base_ptr)local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity);
    }
    local_170._0_4_ =
         Connection::GetID((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
    psVar5 = Connection::GetCharacterName_abi_cxx11_
                       ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
    __args_2 = Connection::GetCharacterClass_abi_cxx11_
                         ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
    local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Player *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Player,std::allocator<Player>,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
              (&local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (Player **)&local_180,(allocator<Player> *)&local_181,(int *)local_170,psVar5,
               __args_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_140._0_8_ + 0x18));
    Player::SetStrength(local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        this->m_str);
    Player::SetEndurance
              (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->m_end);
    Player::SetIntelligence
              (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->m_int);
    Player::SetDexterity
              (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->m_dex);
    Player::SetSkill(local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     this->m_skill);
    Player::SetAttributePoints
              (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               this->m_att_points);
    this_00 = local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    game_data = &(this->super_GameState).game_data;
    peVar2 = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar5 = Player::GetPlayerRaceStr_abi_cxx11_
                       (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    local_d0 = (_Base_ptr)local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + psVar5->_M_string_length);
    GameData::GetRace((GameData *)local_170,(string *)peVar2);
    Player::SetPlayerRace(this_00,(shared_ptr<Race> *)local_170);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
    }
    if (local_d0 != (_Base_ptr)local_c0) {
      operator_delete(local_d0);
    }
    Player::SetCredits(local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,50000
                      );
    pGVar3 = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    Connection::GetUsername_abi_cxx11_
              (&local_70,
               (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    local_150.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_150.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
      }
    }
    GameData::AddCharacter(pGVar3,&local_70,&local_150);
    if (local_150.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pGVar3 = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_f0._M_allocated_capacity = (size_type)(_Base_ptr)local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,GameData::CHARACTER_FILE_abi_cxx11_._M_dataplus._M_p,
               GameData::CHARACTER_FILE_abi_cxx11_._M_dataplus._M_p +
               GameData::CHARACTER_FILE_abi_cxx11_._M_string_length);
    GameData::SaveCharacters(pGVar3,(string *)&local_f0);
    if ((_Base_ptr)local_f0._M_allocated_capacity != (_Base_ptr)local_e0) {
      operator_delete((void *)local_f0._M_allocated_capacity);
    }
    pGVar3 = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_110._0_8_ = (pointer)(local_110 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_110,GameData::ACCOUNT_FILE_abi_cxx11_._M_dataplus._M_p,
               GameData::ACCOUNT_FILE_abi_cxx11_._M_dataplus._M_p +
               GameData::ACCOUNT_FILE_abi_cxx11_._M_string_length);
    GameData::SaveAccounts(pGVar3,(string *)local_110);
    if ((pointer)local_110._0_8_ != (pointer)(local_110 + 0x10)) {
      operator_delete((void *)local_110._0_8_);
    }
    Connection::SetPlayer
              ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               &local_180);
    local_170._0_2_ = 1;
    Connection::SetState
              ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (GameStates *)local_170,game_data);
    if (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_180.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
  }
  else {
    local_160 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_158 = (_Base_ptr)
                (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
    if (local_158 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&local_158->_M_parent = *(int *)&local_158->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&local_158->_M_parent = *(int *)&local_158->_M_parent + 1;
      }
    }
    (*(this->super_GameState)._vptr_GameState[1])(this,&local_160);
    local_140._8_8_ = local_158;
  }
  if ((_Base_ptr)local_140._8_8_ != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
  }
  if (local_130[0] != (_Base_ptr)local_120) {
    operator_delete(local_130[0]);
  }
  return;
}

Assistant:

void CreateCharacterState::processConfirmCharacter(const std::string &input, std::shared_ptr<Connection> connection) {
    std::string command = input;
    Tokenizer::LowerCase(input);
    if(command == "y" or command == "yes") {
        auto character_race = game_data->GetRace(connection->GetCharacterRace());
        std::shared_ptr<Player> player = std::make_shared<Player>(connection->GetID(), connection->GetCharacterName(),
                                                                  connection->GetCharacterClass(), character_race->getRace_name());
        player->SetStrength(m_str);
        player->SetEndurance(m_end);
        player->SetIntelligence(m_int);
        player->SetDexterity(m_dex);
        player->SetSkill(m_skill);
        player->SetAttributePoints(m_att_points);
        player->SetPlayerRace(game_data->GetRace(player->GetPlayerRaceStr()));
        player->SetCredits(50000);
        game_data->AddCharacter(connection->GetUsername(), player);
        game_data->SaveCharacters(GameData::CHARACTER_FILE);
        game_data->SaveAccounts(GameData::ACCOUNT_FILE);
        connection->SetPlayer(player);
        connection->SetState(GameStates::PLAYING, game_data);
    }
    else
        init(connection);
}